

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp)

{
  int iVar1;
  REF_NODE ref_node;
  REF_NODE pRVar2;
  uint uVar3;
  void *pvVar4;
  REF_INT *proc;
  ulong uVar5;
  long lVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  ulong uVar9;
  REF_DBL *pRVar10;
  char *pcVar11;
  REF_DBL (*log_m) [6];
  REF_MPI pRVar12;
  long lVar13;
  uint uVar14;
  size_t __size;
  long lVar15;
  double dVar16;
  uint local_1d8;
  REF_INT n_donor;
  void *local_1d0;
  REF_MPI local_1c8;
  void *local_1c0;
  REF_INT *local_1b8;
  void *local_1b0;
  REF_INT *recept_node;
  REF_INT *donor_ret;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_log_m;
  REF_NODE local_178;
  REF_CELL local_170;
  REF_INT nodes [27];
  REF_DBL log_parent_m [4] [6];
  
  pRVar12 = ref_interp->ref_mpi;
  ref_node = ref_interp->to_grid->node;
  pRVar2 = ref_interp->from_grid->node;
  iVar1 = ref_node->max;
  uVar9 = (ulong)iVar1;
  if ((long)uVar9 < 1) {
    uVar14 = 0;
  }
  else {
    uVar5 = 0;
    uVar14 = 0;
    do {
      if ((-1 < ref_node->global[uVar5]) && (ref_node->ref_mpi->id == ref_node->part[uVar5])) {
        uVar14 = uVar14 + 1;
        local_1d8 = uVar14;
      }
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
    if ((int)uVar14 < 0) {
      pcVar11 = "malloc recept_bary of REF_DBL negative";
      uVar8 = 0x263;
      goto LAB_001e1f73;
    }
  }
  local_170 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  pvVar4 = malloc((ulong)(uVar14 * 4) << 3);
  if (pvVar4 == (void *)0x0) {
    pcVar11 = "malloc recept_bary of REF_DBL NULL";
    uVar8 = 0x263;
  }
  else {
    __size = (ulong)uVar14 << 2;
    local_1d0 = pvVar4;
    pvVar4 = malloc(__size);
    if (pvVar4 == (void *)0x0) {
      pcVar11 = "malloc recept_cell of REF_INT NULL";
      uVar8 = 0x264;
    }
    else {
      local_1b0 = pvVar4;
      recept_node = (REF_INT *)malloc(__size);
      if (recept_node == (REF_INT *)0x0) {
        pcVar11 = "malloc recept_node of REF_INT NULL";
        uVar8 = 0x265;
      }
      else {
        local_1b8 = recept_node;
        pvVar4 = malloc(__size);
        if (pvVar4 == (void *)0x0) {
          pcVar11 = "malloc recept_ret of REF_INT NULL";
          uVar8 = 0x266;
        }
        else {
          local_1c0 = pvVar4;
          proc = (REF_INT *)malloc(__size);
          if (proc != (REF_INT *)0x0) {
            local_1d8 = 0;
            local_1c8 = pRVar12;
            local_178 = pRVar2;
            if (iVar1 < 1) {
              uVar14 = 0;
            }
            else {
              lVar15 = 0;
              uVar14 = 0;
              lVar13 = 0;
              do {
                if ((-1 < ref_node->global[lVar13]) &&
                   (ref_node->ref_mpi->id == ref_node->part[lVar13])) {
                  if (ref_interp->cell[lVar13] == -1) {
                    pcVar11 = "node needs to be localized";
                    uVar8 = 0x26c;
                    goto LAB_001e1f73;
                  }
                  uVar3 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar15),
                                              (REF_DBL *)
                                              ((long)local_1d0 + (long)(int)(uVar14 * 4) * 8));
                  if (uVar3 != 0) {
                    pcVar11 = "clip";
                    uVar8 = 0x26f;
                    goto LAB_001e234e;
                  }
                  lVar6 = (long)(int)uVar14;
                  proc[lVar6] = ref_interp->part[lVar13];
                  *(REF_INT *)((long)local_1b0 + lVar6 * 4) = ref_interp->cell[lVar13];
                  local_1b8[lVar6] = (REF_INT)lVar13;
                  *(REF_INT *)((long)local_1c0 + lVar6 * 4) = local_1c8->id;
                  uVar14 = uVar14 + 1;
                  uVar9 = (ulong)(uint)ref_node->max;
                  local_1d8 = uVar14;
                }
                lVar13 = lVar13 + 1;
                lVar15 = lVar15 + 0x20;
              } while (lVar13 < (int)uVar9);
            }
            pRVar12 = local_1c8;
            uVar3 = ref_mpi_blindsend(local_1c8,proc,local_1b0,1,uVar14,&donor_cell,&n_donor,1);
            if (uVar3 == 0) {
              uVar3 = ref_mpi_blindsend(pRVar12,proc,local_1c0,1,uVar14,&donor_ret,&n_donor,1);
              if (uVar3 == 0) {
                uVar3 = ref_mpi_blindsend(pRVar12,proc,local_1b8,1,uVar14,&donor_node,&n_donor,1);
                pvVar4 = local_1d0;
                if (uVar3 == 0) {
                  uVar3 = ref_mpi_blindsend(pRVar12,proc,local_1d0,4,uVar14,&donor_bary,&n_donor,3);
                  if (uVar3 == 0) {
                    free(proc);
                    free(local_1c0);
                    free(local_1b8);
                    free(local_1b0);
                    free(pvVar4);
                    uVar9 = (ulong)(uint)n_donor;
                    if (n_donor < 0) {
                      pcVar11 = "malloc donor_log_m of REF_DBL negative";
                      uVar8 = 0x28b;
LAB_001e1f73:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,uVar8,"ref_metric_interpolate",pcVar11);
                      return 1;
                    }
                    pvVar4 = malloc(uVar9 * 0x30);
                    if (pvVar4 == (void *)0x0) {
                      pcVar11 = "malloc donor_log_m of REF_DBL NULL";
                      uVar8 = 0x28b;
                      goto LAB_001e219d;
                    }
                    local_1d0 = pvVar4;
                    if (uVar9 != 0) {
                      lVar13 = 0;
                      do {
                        log_m = log_parent_m;
                        uVar3 = ref_cell_nodes(local_170,donor_cell[lVar13],nodes);
                        if (uVar3 != 0) {
                          pcVar11 = "node needs to be localized";
                          uVar8 = 0x28f;
                          goto LAB_001e234e;
                        }
                        lVar15 = 0;
                        do {
                          uVar3 = ref_node_metric_get_log(local_178,nodes[lVar15],*log_m);
                          if (uVar3 != 0) {
                            pcVar11 = "log(parentM)";
                            uVar8 = 0x292;
                            goto LAB_001e234e;
                          }
                          lVar15 = lVar15 + 1;
                          log_m = log_m + 1;
                        } while (lVar15 != 4);
                        pRVar7 = log_parent_m[0];
                        lVar15 = 0;
                        do {
                          *(undefined8 *)((long)pvVar4 + lVar15 * 8 + lVar13 * 0x30) = 0;
                          dVar16 = 0.0;
                          lVar6 = 0;
                          pRVar10 = pRVar7;
                          do {
                            dVar16 = dVar16 + donor_bary
                                              [(ulong)((uint)lVar13 & 0x3fffffff) * 4 + lVar6] *
                                              (*(REF_DBL (*) [6])pRVar10)[0];
                            *(double *)((long)pvVar4 + lVar15 * 8 + lVar13 * 0x30) = dVar16;
                            lVar6 = lVar6 + 1;
                            pRVar10 = (REF_DBL *)((long)pRVar10 + 0x30);
                          } while (lVar6 != 4);
                          lVar15 = lVar15 + 1;
                          pRVar7 = pRVar7 + 1;
                        } while (lVar15 != 6);
                        lVar13 = lVar13 + 1;
                        pRVar12 = local_1c8;
                      } while (lVar13 < n_donor);
                    }
                    if (donor_cell != (REF_INT *)0x0) {
                      free(donor_cell);
                    }
                    if (donor_bary != (REF_DBL *)0x0) {
                      free(donor_bary);
                    }
                    uVar3 = ref_mpi_blindsend(pRVar12,donor_ret,pvVar4,6,n_donor,&recept_log_m,
                                              (REF_INT *)&local_1d8,3);
                    if (uVar3 == 0) {
                      uVar3 = ref_mpi_blindsend(pRVar12,donor_ret,donor_node,1,n_donor,&recept_node,
                                                (REF_INT *)&local_1d8,1);
                      if (uVar3 == 0) {
                        free(local_1d0);
                        if (donor_node != (REF_INT *)0x0) {
                          free(donor_node);
                        }
                        if (donor_ret != (REF_INT *)0x0) {
                          free(donor_ret);
                        }
                        if (0 < (int)local_1d8) {
                          lVar13 = 0;
                          lVar15 = 0;
                          do {
                            uVar3 = ref_node_metric_set_log
                                              (ref_node,recept_node[lVar15],
                                               (REF_DBL *)((long)recept_log_m + lVar13));
                            if (uVar3 != 0) {
                              pcVar11 = "set received log met";
                              uVar8 = 0x2ab;
                              goto LAB_001e234e;
                            }
                            lVar15 = lVar15 + 1;
                            lVar13 = lVar13 + 0x30;
                          } while (lVar15 < (int)local_1d8);
                        }
                        if (recept_node != (REF_INT *)0x0) {
                          free(recept_node);
                        }
                        if (recept_log_m != (REF_DBL *)0x0) {
                          free(recept_log_m);
                        }
                        return 0;
                      }
                      pcVar11 = "blind send node";
                      uVar8 = 0x2a3;
                    }
                    else {
                      pcVar11 = "blind send bary";
                      uVar8 = 0x2a0;
                    }
                  }
                  else {
                    pcVar11 = "blind send bary";
                    uVar8 = 0x283;
                  }
                }
                else {
                  pcVar11 = "blind send node";
                  uVar8 = 0x280;
                }
              }
              else {
                pcVar11 = "blind send ret";
                uVar8 = 0x27d;
              }
            }
            else {
              pcVar11 = "blind send cell";
              uVar8 = 0x27a;
            }
LAB_001e234e:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar8,"ref_metric_interpolate",(ulong)uVar3,pcVar11);
            return uVar3;
          }
          pcVar11 = "malloc recept_proc of REF_INT NULL";
          uVar8 = 0x267;
        }
      }
    }
  }
LAB_001e219d:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
         "ref_metric_interpolate",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL log_parent_m[4][6];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_log_m, *donor_log_m, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_log_m, 6 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (ibary = 0; ibary < 4; ibary++)
      RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
          "log(parentM)");
    for (im = 0; im < 6; im++) {
      donor_log_m[im + 6 * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_log_m[im + 6 * donation] +=
            donor_bary[ibary + 4 * donation] * log_parent_m[ibary][im];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_log_m, 6, n_donor,
                        (void **)(&recept_log_m), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_log_m);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    RSS(ref_node_metric_set_log(to_node, node, &(recept_log_m[6 * receptor])),
        "set received log met");
  }

  ref_free(recept_node);
  ref_free(recept_log_m);

  return REF_SUCCESS;
}